

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionSystemBullet::Visualize(ChCollisionSystemBullet *this,int flags)

{
  if ((flags != 0) &&
     ((this->super_ChCollisionSystem).vis_callback.
      super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    if ((flags & 1U) != 0) {
      (*this->m_debug_drawer->_vptr_cbtIDebugDraw[0xd])(this->m_debug_drawer,1);
    }
    if ((flags & 2U) != 0) {
      (*this->m_debug_drawer->_vptr_cbtIDebugDraw[0xd])(this->m_debug_drawer,2);
    }
    if ((flags & 4U) != 0) {
      (*this->m_debug_drawer->_vptr_cbtIDebugDraw[0xd])(this->m_debug_drawer,8);
    }
    (*this->bt_collision_world->_vptr_cbtCollisionWorld[6])();
    return;
  }
  return;
}

Assistant:

void ChCollisionSystemBullet::Visualize(int flags) {
    if (!vis_callback || flags == VisualizationModes::VIS_None)
        return;

    if (flags & VisualizationModes::VIS_Shapes)
        m_debug_drawer->setDebugMode(cbtIDebugDraw::DBG_DrawWireframe);
    if (flags & VisualizationModes::VIS_Aabb)
        m_debug_drawer->setDebugMode(cbtIDebugDraw::DBG_DrawAabb);
    if (flags & VisualizationModes::VIS_Contacts)
        m_debug_drawer->setDebugMode(cbtIDebugDraw::DBG_DrawContactPoints);

    bt_collision_world->debugDrawWorld();
}